

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

string * __thiscall
sciplot::gnuplot::sizestr_abi_cxx11_
          (string *__return_storage_ptr__,gnuplot *this,size_t width,size_t height,bool asinches)

{
  string *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_t local_78;
  gnuplot *local_70;
  string local_68;
  double local_48;
  string local_40;
  double local_20;
  
  this_00 = &sStack_b8;
  local_78 = width;
  local_70 = this;
  if ((int)height == 0) {
    internal::str<unsigned_long>(&sStack_b8,(unsigned_long *)&local_70);
    std::operator+(&local_98,&sStack_b8,",");
    internal::str<unsigned_long>(&local_68,&local_78);
    std::operator+(__return_storage_ptr__,&local_98,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    auVar1._8_4_ = (int)((ulong)this >> 0x20);
    auVar1._0_8_ = this;
    auVar1._12_4_ = 0x45300000;
    local_20 = ((auVar1._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) * 0.013888888888888888
    ;
    internal::str<double>(&local_68,&local_20);
    std::operator+(&sStack_b8,&local_68,"in,");
    auVar2._8_4_ = (int)(width >> 0x20);
    auVar2._0_8_ = width;
    auVar2._12_4_ = 0x45300000;
    local_48 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)width) - 4503599627370496.0)) *
               0.013888888888888888;
    internal::str<double>(&local_40,&local_48);
    std::operator+(&local_98,&sStack_b8,&local_40);
    std::operator+(__return_storage_ptr__,&local_98,"in");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&sStack_b8);
    this_00 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

inline auto sizestr(std::size_t width, std::size_t height, bool asinches) -> std::string
{
    return asinches ? (internal::str(width * POINT_TO_INCHES) + "in," + internal::str(height * POINT_TO_INCHES) + "in") : (internal::str(width) + "," + internal::str(height));
}